

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QList<bool_(*)(void_**)>_>::resize(QList<QList<bool_(*)(void_**)>_> *this,qsizetype size)

{
  resize_internal(this,size);
  if ((this->d).size < size) {
    QArrayDataPointer<QList<bool_(*)(void_**)>_>::appendInitialize(&this->d,size);
    return;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }